

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptorProto::MergeFrom
          (OneofDescriptorProto *this,OneofDescriptorProto *from)

{
  uint uVar1;
  LogMessage *other;
  string *default_value;
  OneofOptions *this_00;
  OneofOptions *from_00;
  InternalMetadataWithArena *this_01;
  LogFinisher local_b5;
  uint32 cached_has_bits;
  byte local_a1;
  LogMessage local_a0;
  OneofDescriptorProto *local_68;
  OneofDescriptorProto *from_local;
  OneofDescriptorProto *this_local;
  InternalMetadataWithArena *local_50;
  InternalMetadataWithArena *local_48;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_a1 = 0;
  local_68 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x168c);
    local_a1 = 1;
    other = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_b5,other);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  this_01 = &this->_internal_metadata_;
  this_local = (OneofDescriptorProto *)&local_68->_internal_metadata_;
  local_50 = this_01;
  local_48 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom(this_01,&local_28->unknown_fields);
  }
  local_38 = &local_68->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_name(this);
      default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault(&this->name_,default_value,(local_68->name_).ptr_)
      ;
    }
    if ((uVar1 & 2) != 0) {
      this_00 = mutable_options(this);
      from_00 = options(local_68);
      OneofOptions::MergeFrom(this_00,from_00);
    }
  }
  return;
}

Assistant:

void OneofDescriptorProto::MergeFrom(const OneofDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.OneofDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 3u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_options()->::google::protobuf::OneofOptions::MergeFrom(from.options());
    }
  }
}